

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hanim.cpp
# Opt level: O0

Stream * rw::writeHAnim(Stream *stream,int32 param_2,void *object,int32 offset,int32 param_5)

{
  int32 *piVar1;
  int local_44;
  int32 i;
  HAnimHierarchy *hier;
  HAnimData *hanim;
  int32 param_4_local;
  int32 offset_local;
  void *object_local;
  int32 param_1_local;
  Stream *stream_local;
  
  piVar1 = (int32 *)((long)object + (long)offset);
  Stream::writeI32(stream,0x100);
  Stream::writeI32(stream,*piVar1);
  if (*(long *)(piVar1 + 2) == 0) {
    Stream::writeI32(stream,0);
  }
  else {
    piVar1 = *(int32 **)(piVar1 + 2);
    Stream::writeI32(stream,piVar1[1]);
    Stream::writeI32(stream,*piVar1);
    Stream::writeI32(stream,*(int32 *)(*(long *)(piVar1 + 0xc) + 0x18));
    for (local_44 = 0; local_44 < piVar1[1]; local_44 = local_44 + 1) {
      Stream::writeI32(stream,*(int32 *)(*(long *)(piVar1 + 6) + (long)local_44 * 0x18));
      Stream::writeI32(stream,*(int32 *)(*(long *)(piVar1 + 6) + (long)local_44 * 0x18 + 4));
      Stream::writeI32(stream,*(int32 *)(*(long *)(piVar1 + 6) + (long)local_44 * 0x18 + 8));
    }
  }
  return stream;
}

Assistant:

static Stream*
writeHAnim(Stream *stream, int32, void *object, int32 offset, int32)
{
	HAnimData *hanim = PLUGINOFFSET(HAnimData, object, offset);
	stream->writeI32(256);
	stream->writeI32(hanim->id);
	if(hanim->hierarchy == nil){
		stream->writeI32(0);
		return stream;
	}
	HAnimHierarchy *hier = hanim->hierarchy;
	stream->writeI32(hier->numNodes);
	stream->writeI32(hier->flags);
	stream->writeI32(hier->interpolator->maxInterpKeyFrameSize);
	for(int32 i = 0; i < hier->numNodes; i++){
		stream->writeI32(hier->nodeInfo[i].id);
		stream->writeI32(hier->nodeInfo[i].index);
		stream->writeI32(hier->nodeInfo[i].flags);
	}
	return stream;
}